

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

void __thiscall
capnp::compiler::CompilerMain::addError
          (CompilerMain *this,ReadableDirectory *directory,PathPtr path,SourcePos start,
          SourcePos end,StringPtr message)

{
  char *pcVar1;
  uint uVar2;
  char (*params_5) [2];
  int local_7c;
  Array<char> local_78;
  int local_5c;
  String wholeMessage;
  String file;
  int local_24;
  
  params_5 = (char (*) [2])0x11622e;
  getDisplayName(&file,this,directory,path);
  wholeMessage.content.disposer = (ArrayDisposer *)0x0;
  wholeMessage.content.ptr = (char *)0x0;
  wholeMessage.content.size_ = 0;
  uVar2 = start.line;
  if (end.line == uVar2) {
    local_7c = uVar2 + 1;
    local_5c = start.column + 1;
    if (end.column == start.column) {
      kj::
      str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
                ((String *)&local_78,(kj *)&file,(String *)0x20c22a,(char (*) [2])&local_7c,
                 (uint *)0x20c22a,(char (*) [2])&local_5c,(uint *)": error: ",
                 (char (*) [10])&message,(StringPtr *)0x20b012,params_5);
      kj::Array<char>::operator=(&wholeMessage.content,&local_78);
    }
    else {
      local_24 = end.column + 1;
      kj::
      str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
                ((String *)&local_78,(kj *)&file,(String *)0x20c22a,(char (*) [2])&local_7c,
                 (uint *)0x20c22a,(char (*) [2])&local_5c,(uint *)0x20ae24,(char (*) [2])&local_24,
                 (uint *)": error: ",(char (*) [10])&message,(StringPtr *)0x20b012,params_5);
      kj::Array<char>::operator=(&wholeMessage.content,&local_78);
    }
  }
  else {
    local_7c = uVar2 + 1;
    kj::
    str<kj::String&,char_const(&)[2],unsigned_int,char_const(&)[10],kj::StringPtr&,char_const(&)[2]>
              ((String *)&local_78,(kj *)&file,(String *)0x20c22a,(char (*) [2])&local_7c,
               (uint *)": error: ",(char (*) [10])&message,(StringPtr *)0x20b012,params_5);
    kj::Array<char>::operator=(&wholeMessage.content,&local_78);
  }
  kj::Array<char>::~Array(&local_78);
  pcVar1 = wholeMessage.content.ptr;
  if (wholeMessage.content.size_ == 0) {
    pcVar1 = "";
  }
  (*this->context->_vptr_ProcessContext[3])
            (this->context,pcVar1,wholeMessage.content.size_ + (wholeMessage.content.size_ == 0));
  this->hadErrors_ = true;
  kj::Array<char>::~Array(&wholeMessage.content);
  kj::Array<char>::~Array(&file.content);
  return;
}

Assistant:

void addError(const kj::ReadableDirectory& directory, kj::PathPtr path,
                SourcePos start, SourcePos end,
                kj::StringPtr message) override {
    auto file = getDisplayName(directory, path);

    kj::String wholeMessage;
    if (end.line == start.line) {
      if (end.column == start.column) {
        wholeMessage = kj::str(file, ":", start.line + 1, ":", start.column + 1,
                               ": error: ", message, "\n");
      } else {
        wholeMessage = kj::str(file, ":", start.line + 1, ":", start.column + 1,
                               "-", end.column + 1, ": error: ", message, "\n");
      }
    } else {
      // The error spans multiple lines, so just report it on the first such line.
      wholeMessage = kj::str(file, ":", start.line + 1, ": error: ", message, "\n");
    }

    context.error(wholeMessage);
    hadErrors_ = true;
  }